

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoGeometry.cpp
# Opt level: O2

HaF32 HACD::fm_computeMeshVolume(HaF32 *vertices,size_t tcount,HaU32 *indices)

{
  HaU32 i;
  ulong uVar1;
  undefined1 auVar2 [16];
  float fVar3;
  HaF32 HVar4;
  
  fVar3 = 0.0;
  for (uVar1 = 0; uVar1 < tcount; uVar1 = (ulong)((int)uVar1 + 1)) {
    HVar4 = det(vertices + *indices * 3,vertices + indices[1] * 3,vertices + indices[2] * 3);
    indices = indices + 3;
    fVar3 = fVar3 + (float)HVar4;
  }
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar2 = vxorps_avx512vl(ZEXT416((uint)(fVar3 * 0.16666667)),auVar2);
  auVar2 = vmaxss_avx(auVar2,ZEXT416((uint)(fVar3 * 0.16666667)));
  return auVar2._0_4_;
}

Assistant:

hacd::HaF32  fm_computeMeshVolume(const hacd::HaF32 *vertices,size_t tcount,const hacd::HaU32 *indices)
	{
		hacd::HaF32 volume = 0;

		for (hacd::HaU32 i=0; i<tcount; i++,indices+=3)
		{
			const hacd::HaF32 *p1 = &vertices[ indices[0]*3 ];
			const hacd::HaF32 *p2 = &vertices[ indices[1]*3 ];
			const hacd::HaF32 *p3 = &vertices[ indices[2]*3 ];
			volume+=det(p1,p2,p3); // compute the volume of the tetrahedran relative to the origin.
		}

		volume*=(1.0f/6.0f);
		if ( volume < 0 )
			volume*=-1;
		return volume;
	}